

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O0

int32_t spvOpcodeReturnsLogicalPointer(Op opcode)

{
  int32_t local_c;
  Op opcode_local;
  
  if ((((opcode == OpFunctionParameter) || (opcode - OpVariable < 2)) ||
      (opcode - OpAccessChain < 2)) ||
     (((opcode == OpCopyObject || (opcode - OpUntypedVariableKHR < 3)) ||
      (opcode == OpRawAccessChainNV)))) {
    local_c = 1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int32_t spvOpcodeReturnsLogicalPointer(const spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpUntypedAccessChainKHR:
    case spv::Op::OpUntypedInBoundsAccessChainKHR:
    case spv::Op::OpFunctionParameter:
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpCopyObject:
    case spv::Op::OpRawAccessChainNV:
      return true;
    default:
      return false;
  }
}